

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool absl::lts_20240722::flags_internal::anon_unknown_0::ReadFlagsFromEnv
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *flag_names,
               vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               *input_args,bool fail_on_absent_in_env)

{
  byte bVar1;
  bool bVar2;
  char *var_name;
  undefined1 auVar3 [16];
  AlphaNum local_310;
  AlphaNum local_2e0;
  AlphaNum local_2b0;
  AlphaNum local_280;
  undefined1 local_250 [88];
  AlphaNum local_1f8;
  undefined1 local_1c8 [40];
  char local_1a0 [8];
  undefined1 local_198 [8];
  string envval;
  AlphaNum local_148;
  undefined1 local_118 [8];
  string envname;
  AlphaNum local_c8;
  undefined1 local_98 [40];
  char local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag_name;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  bool success;
  bool fail_on_absent_in_env_local;
  vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
  *input_args_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flag_names_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = fail_on_absent_in_env;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
             (char (*) [1])0x13541b);
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(flag_names);
  flag_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(flag_names);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&flag_name);
    if (!bVar2) {
      if ((args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::
        vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>>
        ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                  ((vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>>
                    *)input_args,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
      }
      bVar1 = args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
      local_250[0x24] = '\x01';
      local_250[0x25] = '\0';
      local_250[0x26] = '\0';
      local_250[0x27] = '\0';
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
      return (bool)(bVar1 & 1);
    }
    local_68 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
    bVar2 = std::operator==(local_68,"fromenv");
    if (bVar2) {
LAB_00125a83:
      AlphaNum::AlphaNum(&local_c8,"Infinite recursion on flag ");
      AlphaNum::AlphaNum<std::allocator<char>>((AlphaNum *)((long)&envname.field_2 + 8),local_68);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_98,&local_c8);
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      unique0x10000605 = auVar3;
      absl::lts_20240722::flags_internal::ReportUsageError(auVar3._0_8_,auVar3._8_8_,1);
      std::__cxx11::string::~string((string *)local_98);
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    }
    else {
      bVar2 = std::operator==(local_68,"tryfromenv");
      if (bVar2) goto LAB_00125a83;
      AlphaNum::AlphaNum(&local_148,"FLAGS_");
      AlphaNum::AlphaNum<std::allocator<char>>((AlphaNum *)((long)&envval.field_2 + 8),local_68);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,&local_148);
      std::__cxx11::string::string((string *)local_198);
      var_name = (char *)std::__cxx11::string::c_str();
      bVar2 = GetEnvVar(var_name,(string *)local_198);
      if (bVar2) {
        AlphaNum::AlphaNum(&local_280,"--");
        AlphaNum::AlphaNum<std::allocator<char>>(&local_2b0,local_68);
        AlphaNum::AlphaNum(&local_2e0,"=");
        AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_310,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)local_250,&local_280,&local_2b0,&local_2e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,(value_type *)local_250);
        std::__cxx11::string::~string((string *)local_250);
        local_250[0x24] = '\0';
        local_250[0x25] = '\0';
        local_250[0x26] = '\0';
        local_250[0x27] = '\0';
      }
      else {
        if ((args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
          ;
          AlphaNum::AlphaNum((AlphaNum *)(local_250 + 0x28)," not found in environment");
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1c8,&local_1f8);
          auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c8);
          unique0x10000615 = auVar3;
          absl::lts_20240722::flags_internal::ReportUsageError(auVar3._0_8_,auVar3._8_8_,1);
          std::__cxx11::string::~string((string *)local_1c8);
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        }
        local_250[0x24] = '\x03';
        local_250[0x25] = '\0';
        local_250[0x26] = '\0';
        local_250[0x27] = '\0';
      }
      std::__cxx11::string::~string((string *)local_198);
      std::__cxx11::string::~string((string *)local_118);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

bool ReadFlagsFromEnv(const std::vector<std::string>& flag_names,
                      std::vector<ArgsList>& input_args,
                      bool fail_on_absent_in_env) {
  bool success = true;
  std::vector<std::string> args;

  // This argument represents fake argv[0], which should be present in all arg
  // lists.
  args.emplace_back("");

  for (const auto& flag_name : flag_names) {
    // Avoid infinite recursion.
    if (flag_name == "fromenv" || flag_name == "tryfromenv") {
      flags_internal::ReportUsageError(
          absl::StrCat("Infinite recursion on flag ", flag_name), true);

      success = false;
      continue;
    }

    const std::string envname = absl::StrCat("FLAGS_", flag_name);
    std::string envval;
    if (!GetEnvVar(envname.c_str(), envval)) {
      if (fail_on_absent_in_env) {
        flags_internal::ReportUsageError(
            absl::StrCat(envname, " not found in environment"), true);

        success = false;
      }

      continue;
    }

    args.push_back(absl::StrCat("--", flag_name, "=", envval));
  }

  if (success) {
    input_args.emplace_back(args);
  }

  return success;
}